

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O3

void Cut_CellLoad(void)

{
  FILE *__stream;
  Cut_CMan_t *p;
  char *pcVar1;
  size_t sVar2;
  Cut_Cell_t *pCell;
  uint uVar3;
  int iVar4;
  char pString [1000];
  char acStack_418 [1008];
  
  __stream = fopen("cells22_daomap_iwls.txt","r");
  if (__stream != (FILE *)0x0) {
    p = Cut_CManStart();
    pcVar1 = fgets(acStack_418,1000,__stream);
    while (pcVar1 != (char *)0x0) {
      sVar2 = strlen(acStack_418);
      acStack_418[(int)sVar2] = '\0';
      iVar4 = (int)sVar2 + -1;
      if (iVar4 != 0) {
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch(p->pMem);
        memset(pCell,0,0x98);
        uVar3 = iVar4 * 4 - 1;
        iVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar3 = iVar4 + 1U & 0xf;
        *(uint *)&pCell->field_0x20 = uVar3;
        pCell->nUsed = 1;
        Extra_ReadHexadecimal(pCell->uTruth,acStack_418,uVar3);
        Cut_CellSuppMin(pCell);
        p->nTotal = p->nTotal + 1;
        iVar4 = Cut_CellTableLookup(p,pCell);
        if (iVar4 == 0) {
          p->nGood = p->nGood + 1;
        }
      }
      pcVar1 = fgets(acStack_418,1000,__stream);
    }
    printf("Read %d cells from file \"%s\". Added %d cells to the table.\n",(ulong)(uint)p->nTotal,
           "cells22_daomap_iwls.txt",(ulong)(uint)p->nGood);
    fclose(__stream);
    return;
  }
  printf("Cannot open file \"%s\".\n","cells22_daomap_iwls.txt");
  return;
}

Assistant:

void Cut_CellLoad()
{
    FILE * pFile;
    char * pFileName = "cells22_daomap_iwls.txt";
    char pString[1000];
    Cut_CMan_t * p;
    Cut_Cell_t * pCell;
    int Length; //, i;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
   // start the manager
    p = Cut_CManStart();
    // load truth tables
    while ( fgets(pString, 1000, pFile) )
    {
        Length = strlen(pString);
        pString[Length--] = 0;
        if ( Length == 0 )
            continue;
        // derive the cell
        pCell = (Cut_Cell_t *)Extra_MmFixedEntryFetch( p->pMem );
        memset( pCell, 0, sizeof(Cut_Cell_t) );
        pCell->nVars = Abc_Base2Log(Length*4);
        pCell->nUsed = 1;
//        Extra_TruthCopy( pCell->uTruth, pTruth, nVars );
        Extra_ReadHexadecimal( pCell->uTruth, pString, pCell->nVars );
        Cut_CellSuppMin( pCell );
/*
        // set the elementary permutation
        for ( i = 0; i < (int)pCell->nVars; i++ )
            pCell->CanonPerm[i] = i;
        // canonicize
        pCell->CanonPhase = Extra_TruthSemiCanonicize( pCell->uTruth, p->puAux, pCell->nVars, pCell->CanonPerm, pCell->Store );
*/
        // add to the table
        p->nTotal++;

//        Extra_PrintHexadecimal( stdout, pCell->uTruth, pCell->nVars ); printf( "\n" );
//        if ( p->nTotal == 500 )
//            break;

        if ( !Cut_CellTableLookup( p, pCell ) ) // new cell
            p->nGood++;
    }
    printf( "Read %d cells from file \"%s\". Added %d cells to the table.\n", p->nTotal, pFileName, p->nGood );
    fclose( pFile );
//    return p;
}